

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O0

EC_T_DWORD
DoBusScan(EC_T_DWORD dwInstanceID,CAtEmLogging *poLog,EC_T_SB_STATUS_NTFY_DESC *poStatus,
         EC_T_BOOL bWait,EC_T_BOOL bNtfyActive,EC_T_DWORD dwScanBustimeout)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  CEcTimer local_50 [4];
  EC_T_BOOL bReady;
  CEcTimer oTimeout;
  EC_T_DWORD local_30;
  EC_T_DWORD local_2c;
  EC_T_DWORD dwRes;
  EC_T_DWORD dwScanBustimeout_local;
  EC_T_BOOL bNtfyActive_local;
  EC_T_BOOL bWait_local;
  EC_T_SB_STATUS_NTFY_DESC *poStatus_local;
  CAtEmLogging *poLog_local;
  EC_T_DWORD dwInstanceID_local;
  
  local_2c = dwScanBustimeout;
  dwRes = bNtfyActive;
  dwScanBustimeout_local = bWait;
  _bNtfyActive_local = poStatus;
  poStatus_local = (EC_T_SB_STATUS_NTFY_DESC *)poLog;
  poLog_local._4_4_ = dwInstanceID;
  CEcTimer::CEcTimer(local_50);
  bVar1 = 0;
  local_30 = emIoCtl(poLog_local._4_4_,0x50007,&local_2c,4,(void *)0x0,0,(EC_T_DWORD *)0x0);
  if (local_30 == 0) {
    CEcTimer::Start(local_50,local_2c);
LAB_00150ef1:
    iVar3 = CEcTimer::IsElapsed(local_50);
    bVar2 = false;
    if (iVar3 == 0) {
      bVar2 = (bool)(bVar1 ^ 1);
    }
    if (!bVar2) goto LAB_0015100c;
    local_30 = emIoControl(poLog_local._4_4_,0x50001,0);
    if (local_30 == 0x98110008) {
      LinuxSleep(10);
      goto LAB_00150ef1;
    }
    if (local_30 == 0) {
      do {
        iVar3 = CEcTimer::IsElapsed(local_50);
        if (iVar3 != 0) goto LAB_00150ef1;
        LinuxSleep(10);
        local_30 = emIoCtl(poLog_local._4_4_,0x50002,(void *)0x0,0,_bNtfyActive_local,8,
                           (EC_T_DWORD *)0x0);
        if (local_30 != 0) {
          CAtEmLogging::LogError
                    ((CAtEmLogging *)poStatus_local,
                     "DoBusScan(): Error 0x%x getting the Bus scan status",(ulong)local_30);
          goto LAB_00150ef1;
        }
        local_30 = _bNtfyActive_local->dwResultCode;
      } while ((dwScanBustimeout_local != 0) &&
              ((local_30 == 0x98110008 || (local_30 == 0x98110007))));
      bVar1 = 1;
      goto LAB_00150ef1;
    }
    CAtEmLogging::LogError
              ((CAtEmLogging *)poStatus_local,"DoBusScan(): Error 0x%x when restarting bus scan",
               (ulong)local_30);
LAB_0015100c:
    iVar3 = CEcTimer::IsElapsed(local_50);
    if (iVar3 != 0) {
      local_30 = 0x98110010;
    }
  }
  else {
    CAtEmLogging::LogError
              ((CAtEmLogging *)poStatus_local,
               "Scan Bus feature could not be enabled! (Result = 0x%x)",(ulong)local_30);
  }
  return local_30;
}

Assistant:

EC_T_DWORD DoBusScan
    (EC_T_DWORD                dwInstanceID
    ,CAtEmLogging*             poLog
    ,EC_T_SB_STATUS_NTFY_DESC* poStatus           /**< [out]  bus scan status */
    ,EC_T_BOOL                 bWait              /**< [in]   EC_TRUE if call shall block until the scan is finish */
    ,EC_T_BOOL                 bNtfyActive        /**< [in]   EC_TRUE if notifications are active */
    ,EC_T_DWORD                dwScanBustimeout)  /**< [in]   Timeout value in msec */
{
    EC_T_DWORD dwRes = EC_E_NOERROR;
    CEcTimer   oTimeout;
    EC_T_BOOL  bReady = EC_FALSE;

    EC_UNREFPARM(bNtfyActive);

    /* set timeout */
    dwRes = emIoCtl(dwInstanceID, EC_IOCTL_SB_ENABLE, &dwScanBustimeout, sizeof(EC_T_DWORD), EC_NULL, 0, EC_NULL);
    if (EC_E_NOERROR != dwRes)
    {
        LogErr( "Scan Bus feature could not be enabled! (Result = 0x%x)", dwRes);
        goto Exit;
    }

    oTimeout.Start(dwScanBustimeout);
    while (!oTimeout.IsElapsed() && !bReady)
    {
        dwRes = emIoControl(dwInstanceID, EC_IOCTL_SB_RESTART, EC_NULL);
        if (EC_E_BUSY == dwRes)
        {
            OsSleep(10);
        }
        else if (EC_E_NOERROR != dwRes)
        {
            LogErr("DoBusScan(): Error 0x%x when restarting bus scan", dwRes);
            break;
        }
        else
        {
            while (!oTimeout.IsElapsed())
            {
                OsSleep(10);
                dwRes = emIoCtl(dwInstanceID, EC_IOCTL_SB_STATUS_GET, EC_NULL, 0, poStatus, sizeof(EC_T_SB_STATUS_NTFY_DESC), EC_NULL);
                if (dwRes != EC_E_NOERROR)
                {
                    LogErr("DoBusScan(): Error 0x%x getting the Bus scan status", dwRes);
                    break;
                }
                dwRes = poStatus->dwResultCode;
                if (!bWait || ((dwRes != EC_E_BUSY) && (dwRes != EC_E_NOTREADY)))
                {
                    bReady = EC_TRUE;
                    break;
                }
            }
        }
    }

    if (oTimeout.IsElapsed())
    {
        dwRes = EC_E_TIMEOUT;
    }
Exit:
    return dwRes;
}